

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode junkscan(char *part)

{
  size_t sVar1;
  size_t sVar2;
  size_t nfine;
  size_t n;
  char badbytes [33];
  char *part_local;
  
  memcpy(&n,&DAT_007eb3c0,0x21);
  if (part != (char *)0x0) {
    sVar1 = strlen(part);
    sVar2 = strcspn(part,(char *)&n);
    if (sVar2 != sVar1) {
      return CURLUE_MALFORMED_INPUT;
    }
  }
  return CURLUE_OK;
}

Assistant:

static CURLUcode junkscan(char *part)
{
  char badbytes[]={
    /* */ 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07,
    0x08, 0x09, 0x0a, 0x0b, 0x0c, 0x0d, 0x0e, 0x0f,
    0x10, 0x11, 0x12, 0x13, 0x14, 0x15, 0x16, 0x17,
    0x18, 0x19, 0x1a, 0x1b, 0x1c, 0x1d, 0x1e, 0x1f,
    0x7f,
    0x00 /* zero terminate */
  };
  if(part) {
    size_t n = strlen(part);
    size_t nfine = strcspn(part, badbytes);
    if(nfine != n)
      /* since we don't know which part is scanned, return a generic error
         code */
      return CURLUE_MALFORMED_INPUT;
  }
  return CURLUE_OK;
}